

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::select_base::selected_id(select_base *this,string *id)

{
  pointer peVar1;
  __type _Var2;
  long lVar3;
  cppcms_error *this_00;
  uint i;
  int iVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (id->_M_string_length == 0) {
    iVar4 = -1;
  }
  else {
    uVar5 = 0;
    while( true ) {
      iVar4 = (int)uVar5;
      peVar1 = (this->elements_).
               super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = (long)(this->elements_).
                    super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)peVar1;
      if ((ulong)(lVar3 / 0xd0) <= uVar5) {
        this_00 = (cppcms_error *)__cxa_allocate_exception(0x30,peVar1,lVar3 % 0xd0);
        std::operator+(&local_40,"Select base::invalid index: ",id);
        cppcms_error::cppcms_error(this_00,&local_40);
        __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      _Var2 = std::operator==(id,&peVar1[uVar5].id);
      if (_Var2) break;
      uVar5 = (ulong)(iVar4 + 1);
    }
  }
  this->selected_ = iVar4;
  this->default_selected_ = iVar4;
  return;
}

Assistant:

void select_base::selected_id(std::string id)
{
	if(id.empty()) {
		selected_ = -1;
		default_selected_ = -1;
		return;
	}
	for(unsigned i=0;i<elements_.size();i++) {
		if(id==elements_[i].id) {
			selected_ = i;
			default_selected_ = i;
			return;
		}
	}
	throw cppcms_error("Select base::invalid index: " + id);
}